

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

bool __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
try_push(iterator *this,iter_result *e,read_critical_section *rcs)

{
  olc_node_ptr aleaf;
  bool bVar1;
  
  aleaf.tagged_ptr = (e->node).tagged_ptr;
  if ((aleaf.tagged_ptr & 7) != 0) {
    bVar1 = try_push(this,aleaf,e->key_byte,e->child_index,e->prefix,rcs);
    return bVar1;
  }
  bVar1 = try_push_leaf(this,aleaf,rcs);
  return bVar1;
}

Assistant:

bool try_push(const typename inode_base::iter_result& e,
                  const optimistic_lock::read_critical_section& rcs) {
      const auto node_type = e.node.type();
      if (UNODB_DETAIL_UNLIKELY(node_type == node_type::LEAF)) {
        return try_push_leaf(e.node, rcs);
      }
      return try_push(e.node, e.key_byte, e.child_index, e.prefix, rcs);
    }